

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexManager.cpp
# Opt level: O3

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
IndexManager::FindSuchKey
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          IndexManager *this,STMT *S,TableInfo *T)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *pp_Var2;
  vector<condition,_std::allocator<condition>_> *pvVar3;
  pointer pcVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  long *plVar7;
  iterator iVar8;
  iterator iVar9;
  iterator iVar10;
  iterator iVar11;
  _Rb_tree_node_base *p_Var12;
  long *plVar13;
  pointer pcVar14;
  ulong uVar15;
  _Base_ptr p_Var16;
  undefined8 uVar17;
  _Alloc_hider _Var18;
  ulong uVar19;
  _Self __tmp;
  pointer pcVar20;
  _Base_ptr p_Var21;
  BpTree<int> *this_00;
  BpTree<float> *this_01;
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_02;
  string filename;
  condition C;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> temp2;
  _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_> local_318;
  _Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>> *local_2e8;
  _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_> local_2e0;
  undefined1 *local_2b0;
  long local_2a8;
  undefined1 local_2a0;
  undefined7 uStack_29f;
  int local_28c;
  int local_288;
  long *local_280 [2];
  long local_270 [2];
  undefined8 local_260;
  uint local_258;
  int local_250;
  long *local_248;
  long local_240;
  long local_238 [2];
  undefined8 local_228;
  IndexManager *local_220;
  TableInfo *local_218;
  STMT *local_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  key_type local_108;
  key_type local_e8;
  key_type local_c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>_>_>
  *local_a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>_>_>
  *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  _Base_ptr local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_> local_60;
  
  local_2b0 = &local_2a0;
  local_2a8 = 0;
  local_2a0 = 0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &local_2e0._M_impl.super__Rb_tree_header;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar3 = S->c_list;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_220 = this;
  local_218 = T;
  local_210 = S;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((pvVar3->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pvVar3->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_88 = &(T->indexInfo)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_90 = &S->tableName;
    local_98 = &this->BpTrees_F;
    pcVar20 = (pvVar3->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pcVar14 = (pvVar3->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    local_a0 = &this->BpTrees_I;
    local_a8 = &this->BpTrees_S;
    uVar19 = 0;
    local_28c = 0;
    local_2e8 = (_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>> *)
                __return_storage_ptr__;
    do {
      uVar15 = ((long)pcVar14 - (long)pcVar20 >> 3) * 0x4ec4ec4ec4ec4ec5;
      if (uVar15 < uVar19 || uVar15 - uVar19 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar19);
      }
      local_288 = pcVar20[uVar19].colunmID;
      local_280[0] = local_270;
      _Var18._M_p = pcVar20[uVar19].colunmName._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_280,_Var18._M_p,
                 _Var18._M_p + pcVar20[uVar19].colunmName._M_string_length);
      local_258 = pcVar20[uVar19].op;
      pcVar14 = pcVar20 + uVar19;
      local_260._0_1_ = pcVar14->isIndex;
      local_260._1_3_ = *(undefined3 *)&pcVar14->field_0x29;
      local_260._4_4_ = pcVar14->type;
      local_250 = pcVar20[uVar19].key.type;
      local_248 = local_238;
      pcVar4 = pcVar20[uVar19].key.charV._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,pcVar4,pcVar4 + pcVar20[uVar19].key.charV._M_string_length);
      local_228._0_4_ = pcVar20[uVar19].key.intV;
      local_228._4_4_ = pcVar20[uVar19].key.floatV;
      __return_storage_ptr__ = (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)local_2e8;
      if ((char)local_260 != '\0') {
        std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
        clear(&local_60);
        __return_storage_ptr__ = (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)local_2e8;
        std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
        operator=(&local_60,
                  (_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>
                   *)local_2e8);
        p_Var5 = local_88;
        std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
        clear(&__return_storage_ptr__->_M_t);
        std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
        clear(&local_2e0);
        p_Var16 = (local_218->indexInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var6 = p_Var5;
        p_Var21 = p_Var5;
        if (p_Var16 != (_Base_ptr)0x0) {
          do {
            if (local_288 <= (int)p_Var16[1]._M_color) {
              p_Var6 = p_Var16;
            }
            p_Var16 = (&p_Var16->_M_left)[(int)p_Var16[1]._M_color < local_288];
          } while (p_Var16 != (_Base_ptr)0x0);
          if ((p_Var6 != p_Var5) && (p_Var21 = p_Var6, local_288 < (int)p_Var6[1]._M_color)) {
            p_Var21 = p_Var5;
          }
        }
        std::operator+(&local_80,&local_220->Direction,local_90);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
        local_208 = &local_1f8;
        plVar13 = plVar7 + 2;
        if ((long *)*plVar7 == plVar13) {
          local_1f8 = *plVar13;
          lStack_1f0 = plVar7[3];
        }
        else {
          local_1f8 = *plVar13;
          local_208 = (long *)*plVar7;
        }
        local_200 = plVar7[1];
        *plVar7 = (long)plVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_208,(ulong)p_Var21[1]._M_parent);
        local_1e8 = &local_1d8;
        plVar13 = plVar7 + 2;
        if ((long *)*plVar7 == plVar13) {
          local_1d8 = *plVar13;
          lStack_1d0 = plVar7[3];
        }
        else {
          local_1d8 = *plVar13;
          local_1e8 = (long *)*plVar7;
        }
        local_1e0 = plVar7[1];
        *plVar7 = (long)plVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_1e8);
        pp_Var2 = &local_318._M_impl.super__Rb_tree_header._M_header._M_parent;
        plVar13 = plVar7 + 2;
        if ((_Base_ptr *)*plVar7 == (_Base_ptr *)plVar13) {
          local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar13;
          local_318._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar7[3];
          local_318._M_impl._0_8_ = pp_Var2;
        }
        else {
          local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar13;
          local_318._M_impl._0_8_ = (_Base_ptr *)*plVar7;
        }
        local_318._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[1];
        *plVar7 = (long)plVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_2b0,(string *)&local_318);
        if ((_Base_ptr *)local_318._M_impl._0_8_ != pp_Var2) {
          operator_delete((void *)local_318._M_impl._0_8_,
                          (ulong)((long)&(local_318._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if (local_1e8 != &local_1d8) {
          operator_delete(local_1e8,local_1d8 + 1);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208,local_1f8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if (local_260._4_4_ == 90000) {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,local_2b0,local_2b0 + local_2a8);
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>_>_>
                  ::find(&local_98->_M_t,&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if (local_258 < 6) {
            this_01 = (BpTree<float> *)(iVar9._M_node + 2);
            switch(local_258) {
            case 0:
              BpTree<float>::FindEQ
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_01,
                         local_228._4_4_);
              break;
            case 1:
              BpTree<float>::FindGreater
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_01,
                         local_228._4_4_,true);
              break;
            case 2:
              BpTree<float>::FindGreater
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_01,
                         local_228._4_4_,false);
              break;
            case 3:
              BpTree<float>::FindLess
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_01,
                         local_228._4_4_,true);
              break;
            case 4:
              BpTree<float>::FindLess
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_01,
                         local_228._4_4_,false);
              break;
            case 5:
              BpTree<float>::FindNEQ
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_01,
                         local_228._4_4_);
            }
LAB_0012564d:
            std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>
            ::clear(&local_2e0);
            if (local_318._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              local_2e0._M_impl.super__Rb_tree_header._M_header._M_color =
                   local_318._M_impl.super__Rb_tree_header._M_header._M_color;
              local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent =
                   local_318._M_impl.super__Rb_tree_header._M_header._M_parent;
              local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
                   local_318._M_impl.super__Rb_tree_header._M_header._M_left;
              local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_318._M_impl.super__Rb_tree_header._M_header._M_right;
              (local_318._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                   &p_Var1->_M_header;
              local_2e0._M_impl.super__Rb_tree_header._M_node_count =
                   local_318._M_impl.super__Rb_tree_header._M_node_count;
              local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_318._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_318._M_impl.super__Rb_tree_header._M_header;
              local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_318._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_318._M_impl.super__Rb_tree_header._M_header._M_left;
            }
            std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>
            ::~_Rb_tree(&local_318);
          }
        }
        else if (local_260._4_4_ == 50000) {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,local_2b0,local_2b0 + local_2a8);
          iVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>_>_>
                  ::find(&local_a0->_M_t,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if (local_258 < 6) {
            this_00 = (BpTree<int> *)(iVar8._M_node + 2);
            switch(local_258) {
            case 0:
              BpTree<int>::FindEQ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,
                                  this_00,(int)local_228);
              break;
            case 1:
              BpTree<int>::FindGreater
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_00,
                         (int)local_228,true);
              break;
            case 2:
              BpTree<int>::FindGreater
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_00,
                         (int)local_228,false);
              break;
            case 3:
              BpTree<int>::FindLess
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_00,
                         (int)local_228,true);
              break;
            case 4:
              BpTree<int>::FindLess
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_00,
                         (int)local_228,false);
              break;
            case 5:
              BpTree<int>::FindNEQ
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_00,
                         (int)local_228);
            }
            goto LAB_0012564d;
          }
        }
        else if (120000 < local_260._4_4_) {
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,local_2b0,local_2b0 + local_2a8);
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::find(&local_a8->_M_t,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if (local_258 < 6) {
            this_02 = (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(iVar10._M_node + 2);
            switch(local_258) {
            case 0:
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_128,local_248,local_240 + (long)local_248);
              BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::FindEQ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_02,
                       &local_128);
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              clear(&local_2e0);
              if (local_318._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_color;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_318._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &p_Var1->_M_header;
                local_2e0._M_impl.super__Rb_tree_header._M_node_count =
                     local_318._M_impl.super__Rb_tree_header._M_node_count;
                local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_318._M_impl.super__Rb_tree_header._M_header;
                local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
              }
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              ~_Rb_tree(&local_318);
              uVar17 = local_128.field_2._M_allocated_capacity;
              _Var18._M_p = local_128._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
LAB_00125b6d:
                operator_delete(_Var18._M_p,uVar17 + 1);
              }
              break;
            case 1:
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_148,local_248,local_240 + (long)local_248);
              BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::FindGreater((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_02,
                            &local_148,true);
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              clear(&local_2e0);
              if (local_318._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_color;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_318._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &p_Var1->_M_header;
                local_2e0._M_impl.super__Rb_tree_header._M_node_count =
                     local_318._M_impl.super__Rb_tree_header._M_node_count;
                local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_318._M_impl.super__Rb_tree_header._M_header;
                local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
              }
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              ~_Rb_tree(&local_318);
              uVar17 = local_148.field_2._M_allocated_capacity;
              _Var18._M_p = local_148._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_00125b6d;
              break;
            case 2:
              local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_168,local_248,local_240 + (long)local_248);
              BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::FindGreater((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_02,
                            &local_168,false);
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              clear(&local_2e0);
              if (local_318._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_color;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_318._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &p_Var1->_M_header;
                local_2e0._M_impl.super__Rb_tree_header._M_node_count =
                     local_318._M_impl.super__Rb_tree_header._M_node_count;
                local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_318._M_impl.super__Rb_tree_header._M_header;
                local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
              }
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              ~_Rb_tree(&local_318);
              uVar17 = local_168.field_2._M_allocated_capacity;
              _Var18._M_p = local_168._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) goto LAB_00125b6d;
              break;
            case 3:
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_188,local_248,local_240 + (long)local_248);
              BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::FindLess((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_02,
                         &local_188,true);
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              clear(&local_2e0);
              if (local_318._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_color;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_318._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &p_Var1->_M_header;
                local_2e0._M_impl.super__Rb_tree_header._M_node_count =
                     local_318._M_impl.super__Rb_tree_header._M_node_count;
                local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_318._M_impl.super__Rb_tree_header._M_header;
                local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
              }
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              ~_Rb_tree(&local_318);
              uVar17 = local_188.field_2._M_allocated_capacity;
              _Var18._M_p = local_188._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) goto LAB_00125b6d;
              break;
            case 4:
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1a8,local_248,local_240 + (long)local_248);
              BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::FindLess((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_02,
                         &local_1a8,false);
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              clear(&local_2e0);
              if (local_318._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_color;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_318._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &p_Var1->_M_header;
                local_2e0._M_impl.super__Rb_tree_header._M_node_count =
                     local_318._M_impl.super__Rb_tree_header._M_node_count;
                local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_318._M_impl.super__Rb_tree_header._M_header;
                local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
              }
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              ~_Rb_tree(&local_318);
              uVar17 = local_1a8.field_2._M_allocated_capacity;
              _Var18._M_p = local_1a8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) goto LAB_00125b6d;
              break;
            case 5:
              local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1c8,local_248,local_240 + (long)local_248);
              BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::FindNEQ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_02,
                        &local_1c8);
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              clear(&local_2e0);
              if (local_318._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_color;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_318._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &p_Var1->_M_header;
                local_2e0._M_impl.super__Rb_tree_header._M_node_count =
                     local_318._M_impl.super__Rb_tree_header._M_node_count;
                local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_318._M_impl.super__Rb_tree_header._M_header;
                local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
              }
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              ~_Rb_tree(&local_318);
              uVar17 = local_1c8.field_2._M_allocated_capacity;
              _Var18._M_p = local_1c8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) goto LAB_00125b6d;
            }
          }
        }
        p_Var12 = local_2e0._M_impl.super__Rb_tree_header._M_header._M_left;
        if (local_28c == 0) {
          std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
          operator=(&__return_storage_ptr__->_M_t,&local_2e0);
        }
        else {
          for (; (_Rb_tree_header *)p_Var12 != p_Var1;
              p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
            iVar11 = std::
                     _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>
                     ::find(&local_60,(key_type *)(p_Var12 + 1));
            if ((_Rb_tree_header *)iVar11._M_node != &local_60._M_impl.super__Rb_tree_header) {
              std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
              _M_insert_unique<Addr_const&>
                        ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>
                          *)__return_storage_ptr__,(Addr *)(p_Var12 + 1));
            }
          }
        }
        local_28c = local_28c + 1;
      }
      if (local_248 != local_238) {
        operator_delete(local_248,local_238[0] + 1);
      }
      if (local_280[0] != local_270) {
        operator_delete(local_280[0],local_270[0] + 1);
      }
      uVar19 = uVar19 + 1;
      pcVar20 = (local_210->c_list->super__Vector_base<condition,_std::allocator<condition>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pcVar14 = (local_210->c_list->super__Vector_base<condition,_std::allocator<condition>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      uVar15 = ((long)pcVar14 - (long)pcVar20 >> 3) * 0x4ec4ec4ec4ec4ec5;
    } while (uVar19 <= uVar15 && uVar15 - uVar19 != 0);
  }
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::~_Rb_tree
            (&local_60);
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::~_Rb_tree
            (&local_2e0);
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,CONCAT71(uStack_29f,local_2a0) + 1);
  }
  return (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
         (_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>> *)
         __return_storage_ptr__;
}

Assistant:

set<Addr> IndexManager::FindSuchKey(STMT S, TableInfo T) {
    string filename;
    int i, count = 0;
    set<Addr> ans, temp1, temp2;
    for (i = 0; i < S.c_list->size(); i++) {
        condition C = S.c_list->at(i);
        if (!C.isIndex)
            continue;						//如果不是index的约束条件，略过
        //将当前结果传给temp2作为中间变量
        temp2.clear();
        temp2 = ans;
        ans.clear();
        temp1.clear();
        int IndexColumn = C.colunmID;
        map<int, string>::iterator temp = T.indexInfo.find(IndexColumn);
        filename = Direction + S.tableName + "_" + temp->second + "_idx.dat";
        if (C.type == 50000) {
            BpTree<int>& Tree = FindBpTree_I(filename);
            switch (C.op) {
                case 0: temp1 = Tree.FindEQ(C.key.intV);			break;
                case 1: temp1 = Tree.FindGreater(C.key.intV, true); break;
                case 2: temp1 = Tree.FindGreater(C.key.intV, false);break;
                case 3: temp1 = Tree.FindLess(C.key.intV, true);	break;
                case 4: temp1 = Tree.FindLess(C.key.intV, false);	break;
                case 5: temp1 = Tree.FindNEQ(C.key.intV);			break;
                default:break;
            }
        }
        else if (C.type == 90000) {
            BpTree<float>& Tree = FindBpTree_F(filename);
            switch (C.op) {
                case 0: temp1 = Tree.FindEQ(C.key.floatV);				break;
                case 1: temp1 = Tree.FindGreater(C.key.floatV, true);	break;
                case 2: temp1 = Tree.FindGreater(C.key.floatV, false);	break;
                case 3: temp1 = Tree.FindLess(C.key.floatV, true);		break;
                case 4: temp1 = Tree.FindLess(C.key.floatV, false);		break;
                case 5: temp1 = Tree.FindNEQ(C.key.floatV);				break;
                default:break;
            }
        }
        else if (C.type > 120000) {
            BpTree<string>& Tree = FindBpTree_S(filename);
            switch (C.op) {
                case 0: temp1 = Tree.FindEQ(C.key.charV);				break;
                case 1: temp1 = Tree.FindGreater(C.key.charV, true);	break;
                case 2: temp1 = Tree.FindGreater(C.key.charV, false);	break;
                case 3: temp1 = Tree.FindLess(C.key.charV, true);		break;
                case 4: temp1 = Tree.FindLess(C.key.charV, false);		break;
                case 5: temp1 = Tree.FindNEQ(C.key.charV);				break;
                default:
                    break;
            }
        }
        if (count == 0) {
            ans = temp1;				//如果是第一个条件，那么得到的结果无需跟temp2取交集
        }
        else {
            set<Addr>::iterator it;		//如果不是第一个条件，得到的结果需要跟之前的结果temp2取交集
            it = temp1.begin();
            while (it != temp1.end()) {
                if (temp2.find(*it) != temp2.end())
                    ans.insert(*it);
                it++;
            }
        }
        count++;						//对索引条件计数
    }
    return ans;
}